

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

void nni_msgq_run_putq(nni_msgq *mq)

{
  uint uVar1;
  nni_aio *aio;
  nni_msg *m;
  size_t count;
  nni_aio *aio_00;
  nni_aio *raio;
  size_t len;
  nni_msg *msg;
  nni_aio *waio;
  nni_msgq *mq_local;
  
  while( true ) {
    while( true ) {
      aio = (nni_aio *)nni_list_first(&mq->mq_aio_putq);
      if (aio == (nni_aio *)0x0) {
        return;
      }
      m = nni_aio_get_msg(aio);
      count = nni_msg_len(m);
      aio_00 = (nni_aio *)nni_list_first(&mq->mq_aio_getq);
      if (aio_00 == (nni_aio *)0x0) break;
      nni_aio_set_msg(aio,(nni_msg *)0x0);
      nni_aio_list_remove(aio);
      nni_aio_list_remove(aio_00);
      nni_aio_finish_msg(aio_00,m);
      nni_aio_finish(aio,NNG_OK,count);
    }
    if (mq->mq_cap <= mq->mq_len) break;
    nni_list_remove(&mq->mq_aio_putq,aio);
    uVar1 = mq->mq_put;
    mq->mq_put = uVar1 + 1;
    mq->mq_msgs[uVar1] = m;
    if (mq->mq_put == mq->mq_alloc) {
      mq->mq_put = 0;
    }
    mq->mq_len = mq->mq_len + 1;
    nni_aio_set_msg(aio,(nni_msg *)0x0);
    nni_aio_finish(aio,NNG_OK,count);
  }
  return;
}

Assistant:

static void
nni_msgq_run_putq(nni_msgq *mq)
{
	nni_aio *waio;

	while ((waio = nni_list_first(&mq->mq_aio_putq)) != NULL) {
		nni_msg *msg = nni_aio_get_msg(waio);
		size_t   len = nni_msg_len(msg);
		nni_aio *raio;

		// The presence of any blocked reader indicates that
		// the queue is empty, otherwise it would have just taken
		// data from the queue.
		if ((raio = nni_list_first(&mq->mq_aio_getq)) != NULL) {

			nni_aio_set_msg(waio, NULL);
			nni_aio_list_remove(waio);
			nni_aio_list_remove(raio);
			nni_aio_finish_msg(raio, msg);
			nni_aio_finish(waio, 0, len);
			continue;
		}

		// Otherwise if we have room in the buffer, just queue it.
		if (mq->mq_len < mq->mq_cap) {
			nni_list_remove(&mq->mq_aio_putq, waio);
			mq->mq_msgs[mq->mq_put++] = msg;
			if (mq->mq_put == mq->mq_alloc) {
				mq->mq_put = 0;
			}
			mq->mq_len++;
			nni_aio_set_msg(waio, NULL);
			nni_aio_finish(waio, 0, len);
			continue;
		}

		// Unable to make progress, leave the aio where it is.
		break;
	}
}